

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::Verify(LargeHeapBlock *this,Recycler *recycler)

{
  byte bVar1;
  LargeObjectHeader *this_00;
  ulong uVar2;
  LargeObjectHeader *address;
  uint local_34;
  
  address = (LargeObjectHeader *)(this->super_HeapBlock).address;
  if (this->allocCount == 0) {
    local_34 = 0;
  }
  else {
    uVar2 = 0;
    local_34 = 0;
    do {
      this_00 = (LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar2];
      if (this_00 == (LargeObjectHeader *)0x0) {
        for (this_00 = (LargeObjectHeader *)(this->freeList).entries;
            this_00 != (LargeObjectHeader *)0x0;
            this_00 = *(LargeObjectHeader **)&this_00->attributesAndChecksum) {
          if (uVar2 == this_00->objectIndex) {
            Recycler::VerifyCheck
                      ((uint)((LargeHeapBlock *)this_00->next == this),L"Invalid heap block",this,
                       (LargeHeapBlock *)this_00->next);
            Recycler::VerifyCheck
                      ((uint)(address <= this_00),L"LargeHeapBlock invalid object header order",
                       (this->super_HeapBlock).address,this_00);
            Recycler::VerifyCheckFill(address,(long)this_00 - (long)address);
            Recycler::VerifyCheckPad(recycler,this_00 + 1,this_00->objectSize);
            goto LAB_00248f1a;
          }
        }
      }
      else {
        Recycler::VerifyCheck
                  ((uint)(address <= this_00),L"LargeHeapBlock invalid object header order",
                   (this->super_HeapBlock).address,this_00);
        Recycler::VerifyCheckFill(address,(long)this_00 - (long)address);
        Recycler::VerifyCheck
                  ((uint)(uVar2 == this_00->objectIndex),L"LargeHeapBlock object index mismatch",
                   (this->super_HeapBlock).address,this_00);
        Recycler::VerifyCheckPad(recycler,this_00 + 1,this_00->objectSize);
        bVar1 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
        local_34 = local_34 + (bVar1 >> 7);
LAB_00248f1a:
        address = (LargeObjectHeader *)((long)&this_00[1].objectIndex + this_00->objectSize);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->allocCount);
    address = (LargeObjectHeader *)(this->super_HeapBlock).address;
  }
  Recycler::VerifyCheck
            ((uint)(local_34 == this->finalizeCount),
             L"LargeHeapBlock finalize object count mismatch",address,&this->finalizeCount);
  return;
}

Assistant:

void
LargeHeapBlock::Verify(Recycler * recycler)
{
    char * lastAddress = this->address;
    uint verifyFinalizeCount = 0;
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];
        if (header == nullptr)
        {
            // Check if the object if on the free list
            LargeHeapBlockFreeListEntry* current = this->freeList.entries;

            while (current != nullptr)
            {
                // Verify the free listed object
                if (current->headerIndex == i)
                {
                    BYTE* objectAddress = (BYTE *)current + sizeof(LargeObjectHeader);
                    Recycler::VerifyCheck(current->heapBlock == this, _u("Invalid heap block"), this, current->heapBlock);
                    Recycler::VerifyCheck((char *)current >= lastAddress, _u("LargeHeapBlock invalid object header order"), this->address, current);
                    Recycler::VerifyCheckFill(lastAddress, (char *)current - lastAddress);
                    recycler->VerifyCheckPad(objectAddress, current->objectSize);
                    lastAddress = (char *) objectAddress + current->objectSize;
                    break;
                }

                current = current->next;
            }

            continue;
        }

        Recycler::VerifyCheck((char *)header >= lastAddress, _u("LargeHeapBlock invalid object header order"), this->address, header);
        Recycler::VerifyCheckFill(lastAddress, (char *)header - lastAddress);
        Recycler::VerifyCheck(header->objectIndex == i, _u("LargeHeapBlock object index mismatch"), this->address, &header->objectIndex);
        recycler->VerifyCheckPad((BYTE *)header->GetAddress(), header->objectSize);

        verifyFinalizeCount += ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) != 0);
        lastAddress = (char *)header->GetAddress() + header->objectSize;
    }

    Recycler::VerifyCheck(verifyFinalizeCount == this->finalizeCount, _u("LargeHeapBlock finalize object count mismatch"), this->address, &this->finalizeCount);
}